

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_utf8.c
# Opt level: O2

char * cm_utf8_decode_character(char *first,char *last,uint *pc)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  
  if (first != last) {
    bVar1 = *first;
    uVar3 = (uint)bVar1;
    bVar2 = ""[bVar1];
    if ((1 < bVar2 - 7) && (bVar2 != 1)) {
      if (bVar2 != 0) {
        uVar3 = (uint)(cm_utf8_mask[bVar2] & bVar1);
        if ((bVar2 != 1) && (first + 1 != last)) {
          return (char *)0x0;
        }
        if (1 < bVar2) {
          return (char *)0x0;
        }
        if (0x10ffff < uVar3) {
          return (char *)0x0;
        }
        if (uVar3 < cm_utf8_min[bVar2]) {
          return (char *)0x0;
        }
      }
      *pc = uVar3;
      return first + 1;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* cm_utf8_decode_character(const char* first, const char* last,
                                     unsigned int* pc)
{
  /* We need at least one byte.  */
  if (first == last) {
    return 0;
  }

  /* Count leading ones in the first byte.  */
  unsigned char c = (unsigned char)*first++;
  unsigned char const ones = cm_utf8_ones[c];
  switch (ones) {
    case 0:
      *pc = c;
      return first; /* One-byte character.  */
    case 1:
    case 7:
    case 8:
      return 0; /* Invalid leading byte.  */
    default:
      break;
  }

  /* Extract bits from this multi-byte character.  */
  {
    unsigned int uc = c & cm_utf8_mask[ones];
    int left;
    for (left = ones - 1; left && first != last; --left) {
      c = (unsigned char)*first++;
      if (cm_utf8_ones[c] != 1) {
        return 0;
      }
      uc = (uc << 6) | (c & cm_utf8_mask[1]);
    }

    if (left > 0 || uc < cm_utf8_min[ones]) {
      return 0;
    }

    /* UTF-16 surrogate halves. */
    if (0xD800 <= uc && uc <= 0xDFFF) {
      return 0;
    }

    /* Invalid codepoints. */
    if (0x10FFFF < uc) {
      return 0;
    }

    *pc = uc;
    return first;
  }
}